

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  Vector *col;
  unsigned_long *puVar1;
  idx_t i;
  Allocator *pAVar2;
  long lVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  ValidityMask *mask;
  WriteStream *ser;
  float_na_equal *value;
  idx_t r;
  idx_t iVar6;
  string local_60;
  StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *local_40;
  DlbaEncoder *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_40 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01bc1fd1_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_60);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = (Vector *)input_column->data;
  mask = &input_column->validity;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,true>
                (col,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,false>
              (col,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01bc1fd1_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar4 = iVar6, (puVar1[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
          local_60._M_dataplus._M_p._0_4_ = *(float *)(&col->vector_type + iVar4 * 4);
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(&col->vector_type + iVar4 * 4));
          DbpEncoder::BeginWrite<float>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(float *)&local_60);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar4 + 1;
          goto LAB_01bc2346;
        }
        iVar6 = iVar6 + 1;
      } while (chunk_end != iVar6);
    }
    else {
LAB_01bc2346:
      if (chunk_start < chunk_end) {
        do {
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) ||
             ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
            local_60._M_dataplus._M_p._0_4_ = *(float *)(&col->vector_type + chunk_start * 4);
            FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                      (stats,*(float *)(&col->vector_type + chunk_start * 4));
            DbpEncoder::WriteValue<float>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,(float *)&local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar4 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar4 = iVar6, (puVar1[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
          local_60._M_dataplus._M_p._0_4_ = *(float *)(&col->vector_type + iVar4 * 4);
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(&col->vector_type + iVar4 * 4));
          local_38 = (DlbaEncoder *)(page_state_p + 0x909);
          pAVar2 = BufferAllocator::Get
                             (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<float>(local_38,pAVar2,temp_writer,(float *)&local_60);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar4 + 1;
          goto LAB_01bc2210;
        }
        iVar6 = iVar6 + 1;
      } while (chunk_end != iVar6);
    }
    else {
LAB_01bc2210:
      if (chunk_start < chunk_end) {
        do {
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) ||
             ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
            local_60._M_dataplus._M_p._0_4_ = *(float *)(&col->vector_type + chunk_start * 4);
            FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                      (stats,*(float *)(&col->vector_type + chunk_start * 4));
            DlbaEncoder::WriteValue<float>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(float *)&local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar4, (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
          local_60._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_60,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_01bc22a7;
        }
        iVar4 = iVar4 + 1;
      } while (chunk_end != iVar4);
    }
    else {
LAB_01bc22a7:
      if (iVar6 < chunk_end) {
        value = (float_na_equal *)(&col->vector_type + iVar6 * 4);
        do {
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0))
          {
            ppVar5 = PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                     ::Lookup((PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                               *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
            local_60._M_dataplus._M_p._0_4_ = (float)ppVar5->index;
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_60);
          }
          iVar6 = iVar6 + 1;
          value = value + 4;
        } while (chunk_end != iVar6);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar2 = BufferAllocator::Get
                         (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar2);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar1 == (unsigned_long *)0x0) ||
           ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
          local_60._M_dataplus._M_p._0_4_ = *(float *)(&col->vector_type + chunk_start * 4);
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(&col->vector_type + chunk_start * 4));
          lVar3 = 0;
          do {
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar3 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
                 *(undefined1 *)((long)&local_60._M_dataplus._M_p + lVar3);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}